

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qx509_openssl.cpp
# Opt level: O2

QString * __thiscall
QTlsPrivate::X509CertificateOpenSSL::toText
          (QString *__return_storage_ptr__,X509CertificateOpenSSL *this)

{
  QVLAStorage<1UL,_1UL,_16384LL> *__s;
  X509 *b;
  Data *pDVar1;
  char *pcVar2;
  qsizetype qVar3;
  uint uVar4;
  BIO_METHOD *a;
  BIO *a_00;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_4078;
  QArrayDataPointer<char> local_4058;
  QVarLengthArray<char,_16384LL> local_4038;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  b = this->x509;
  if (b == (X509 *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) goto LAB_0011bbda;
    (__return_storage_ptr__->d).d = (Data *)0x0;
    (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
    (__return_storage_ptr__->d).size = 0;
  }
  else {
    local_4058.d = (Data *)0x0;
    local_4058.ptr = (char *)0x0;
    local_4058.size = 0;
    a = q_BIO_s_mem();
    a_00 = q_BIO_new(a);
    if (a_00 == (BIO *)0x0) {
      (__return_storage_ptr__->d).d = (Data *)0x0;
      (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
      (__return_storage_ptr__->d).size = 0;
    }
    else {
      q_X509_print(a_00,b);
      __s = &local_4038.super_QVLAStorage<1UL,_1UL,_16384LL>;
      memset(__s,0xaa,0x4000);
      local_4038.super_QVLABase<char>.super_QVLABaseBase.a = 0x4000;
      local_4038.super_QVLABase<char>.super_QVLABaseBase.s = 0;
      local_4038.super_QVLABase<char>.super_QVLABaseBase.ptr = __s;
      uVar4 = q_BIO_read(a_00,__s,0x4000);
      if (0 < (int)uVar4) {
        QByteArray::QByteArray
                  ((QByteArray *)&local_4078,
                   (char *)local_4038.super_QVLABase<char>.super_QVLABaseBase.ptr,(ulong)uVar4);
        qVar3 = local_4058.size;
        pcVar2 = local_4058.ptr;
        pDVar1 = local_4058.d;
        local_4058.d = local_4078.d;
        local_4058.ptr = local_4078.ptr;
        local_4078.d = pDVar1;
        local_4078.ptr = pcVar2;
        local_4058.size = local_4078.size;
        local_4078.size = qVar3;
        QArrayDataPointer<char>::~QArrayDataPointer(&local_4078);
      }
      QString::fromLatin1<void>(__return_storage_ptr__,(QByteArray *)&local_4058);
      QVarLengthArray<char,_16384LL>::~QVarLengthArray(&local_4038);
      q_BIO_free(a_00);
    }
    QArrayDataPointer<char>::~QArrayDataPointer(&local_4058);
    if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
LAB_0011bbda:
      __stack_chk_fail();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

QString X509CertificateOpenSSL::toText() const
{
    if (!x509)
        return {};

    return x509ToText(x509);
}